

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::ProcessHorizontal(Clipper *this,TEdge *horzEdge)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  TEdge *e2;
  clipperException *this_00;
  TEdge *e2_00;
  TEdge *pTVar7;
  TEdge *e1;
  TEdge *e1_00;
  IntersectProtects protects;
  IntPoint local_58;
  long64 local_48;
  long local_40;
  TEdge *horzEdge_local;
  
  local_48 = horzEdge->xcurr;
  lVar4 = horzEdge->xtop;
  horzEdge_local = horzEdge;
  if (horzEdge->nextInLML == (TEdge *)0x0) {
    e2 = GetMaximaPair(horzEdge);
  }
  else {
    e2 = (TEdge *)0x0;
  }
  local_40 = (ulong)(lVar4 <= local_48) * 8 + 0x70;
  e1_00 = (&horzEdge->nextInAEL)[lVar4 <= local_48];
LAB_005875f7:
  if (e1_00 == (TEdge *)0x0) goto LAB_00587810;
  pTVar7 = *(TEdge **)((long)&e1_00->xbot + local_40);
  if (e2 == (TEdge *)0x0) {
    lVar5 = e1_00->xcurr;
    if (lVar4 <= local_48) {
      if (lVar4 <= lVar5) goto code_r0x005876be;
LAB_0058775e:
      e1_00 = pTVar7;
      if (this->m_SortedEdges != (TEdge *)0x0) {
LAB_00587810:
        if (horzEdge->nextInLML != (TEdge *)0x0) {
LAB_00587817:
          if (-1 < horzEdge->outIdx) {
            local_58.X = horzEdge->xtop;
            local_58.Y = horzEdge->ytop;
            AddOutPt(this,horzEdge,&local_58);
          }
          UpdateEdgeIntoAEL(this,&horzEdge_local);
          return;
        }
        if (-1 < horzEdge->outIdx) {
          uVar2 = horzEdge->ycurr;
          uVar3 = horzEdge->xtop;
          local_58.Y._0_4_ = (int)uVar2;
          local_58.X = uVar3;
          local_58.Y._4_4_ = (int)((ulong)uVar2 >> 0x20);
          IntersectEdges(this,horzEdge,e2,&local_58,ipBoth);
        }
        if (e2 == (TEdge *)0x0) {
          __assert_fail("eMaxPair",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/clipper/clipper.cpp"
                        ,0x988,"void ClipperLib::Clipper::ProcessHorizontal(TEdge *)");
        }
        if (e2->outIdx < 0) {
          DeleteFromAEL(this,e2);
          DeleteFromAEL(this,horzEdge);
          return;
        }
        this_00 = (clipperException *)__cxa_allocate_exception(0x28);
        clipperException::clipperException(this_00,"ProcessHorizontal error");
LAB_00587905:
        __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
      }
      goto LAB_005875f7;
    }
    if (lVar4 < lVar5) goto LAB_0058775e;
code_r0x005876be:
    if (lVar5 != horzEdge->xtop) goto LAB_00587612;
    if (horzEdge->nextInLML == (TEdge *)0x0) {
      __assert_fail("horzEdge->nextInLML",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/clipper/clipper.cpp"
                    ,0x947,"void ClipperLib::Clipper::ProcessHorizontal(TEdge *)");
    }
    bVar6 = SlopesEqual(e1_00,horzEdge->nextInLML,
                        (bool)(this->_vptr_Clipper[-3] + 0x10)
                              [(long)&(this->m_PolyOuts).
                                      super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                              ]);
    if (bVar6) {
      if ((-1 < horzEdge->outIdx) && (-1 < e1_00->outIdx)) {
        AddJoin(this,horzEdge->nextInLML,e1_00,horzEdge->outIdx,-1);
      }
      goto LAB_00587810;
    }
    dVar1 = horzEdge->nextInLML->dx;
    if (e1_00->dx <= dVar1 && dVar1 != e1_00->dx) goto LAB_00587817;
  }
LAB_00587612:
  if (e1_00 == e2) {
    if (local_48 < lVar4) {
      local_58.Y = horzEdge->ycurr;
      local_58.X = e1_00->xcurr;
      pTVar7 = e1_00;
      e1_00 = horzEdge;
    }
    else {
      local_58.Y = horzEdge->ycurr;
      local_58.X = e1_00->xcurr;
      pTVar7 = horzEdge;
    }
    IntersectEdges(this,e1_00,pTVar7,&local_58,ipNone);
    if (e2->outIdx < 0) {
      return;
    }
    this_00 = (clipperException *)__cxa_allocate_exception(0x28);
    clipperException::clipperException(this_00,"ProcessHorizontal error");
    goto LAB_00587905;
  }
  if (((1e-20 <= ABS(e1_00->dx + 1e+40)) || (bVar6 = IsMinima(e1_00), bVar6)) ||
     (local_58.X = e1_00->xcurr, e1_00->xtop < local_58.X)) {
    if (lVar4 <= local_48) {
      local_58.X = e1_00->xcurr;
      goto LAB_00587711;
    }
    local_58.X = e1_00->xcurr;
LAB_0058766c:
    local_58.Y = horzEdge->ycurr;
    bVar6 = IsTopHorz(this,local_58.X);
    protects = (uint)!bVar6 * 2 + ipLeft;
    e2_00 = e1_00;
    e1 = horzEdge;
  }
  else {
    if (local_48 < lVar4) goto LAB_0058766c;
LAB_00587711:
    local_58.Y = horzEdge->ycurr;
    bVar6 = IsTopHorz(this,local_58.X);
    protects = bVar6 ^ ipBoth;
    e2_00 = horzEdge;
    e1 = e1_00;
  }
  IntersectEdges(this,e1,e2_00,&local_58,protects);
  SwapPositionsInAEL(this,horzEdge,e1_00);
  e1_00 = pTVar7;
  goto LAB_005875f7;
}

Assistant:

void Clipper::ProcessHorizontal(TEdge *horzEdge)
{
  Direction dir;
  long64 horzLeft, horzRight;

  if( horzEdge->xcurr < horzEdge->xtop )
  {
    horzLeft = horzEdge->xcurr;
    horzRight = horzEdge->xtop;
    dir = dLeftToRight;
  } else
  {
    horzLeft = horzEdge->xtop;
    horzRight = horzEdge->xcurr;
    dir = dRightToLeft;
  }

  TEdge* eMaxPair;
  if( horzEdge->nextInLML ) eMaxPair = 0;
  else eMaxPair = GetMaximaPair(horzEdge);

  TEdge* e = GetNextInAEL( horzEdge , dir );
  while( e )
  {
    TEdge* eNext = GetNextInAEL( e, dir );

    if (eMaxPair ||
      ((dir == dLeftToRight) && (e->xcurr <= horzRight)) ||
      ((dir == dRightToLeft) && (e->xcurr >= horzLeft)))
    {
      //ok, so far it looks like we're still in range of the horizontal edge
      if ( e->xcurr == horzEdge->xtop && !eMaxPair )
      {
        assert(horzEdge->nextInLML);
        if (SlopesEqual(*e, *horzEdge->nextInLML, m_UseFullRange))
        {
          //if output polygons share an edge, they'll need joining later ...
          if (horzEdge->outIdx >= 0 && e->outIdx >= 0)
            AddJoin(horzEdge->nextInLML, e, horzEdge->outIdx);
          break; //we've reached the end of the horizontal line
        }
        else if (e->dx < horzEdge->nextInLML->dx)
        //we really have got to the end of the intermediate horz edge so quit.
        //nb: More -ve slopes follow more +ve slopes ABOVE the horizontal.
          break;
      }

      if( e == eMaxPair )
      {
        //horzEdge is evidently a maxima horizontal and we've arrived at its end.
        if (dir == dLeftToRight)
          IntersectEdges(horzEdge, e, IntPoint(e->xcurr, horzEdge->ycurr), ipNone);
        else
          IntersectEdges(e, horzEdge, IntPoint(e->xcurr, horzEdge->ycurr), ipNone);
        if (eMaxPair->outIdx >= 0) throw clipperException("ProcessHorizontal error");
        return;
      }
      else if( NEAR_EQUAL(e->dx, HORIZONTAL) &&  !IsMinima(e) && !(e->xcurr > e->xtop) )
      {
        //An overlapping horizontal edge. Overlapping horizontal edges are
        //processed as if layered with the current horizontal edge (horizEdge)
        //being infinitesimally lower that the next (e). Therfore, we
        //intersect with e only if e.xcurr is within the bounds of horzEdge ...
        if( dir == dLeftToRight )
          IntersectEdges( horzEdge , e, IntPoint(e->xcurr, horzEdge->ycurr),
            (IsTopHorz( e->xcurr ))? ipLeft : ipBoth );
        else
          IntersectEdges( e, horzEdge, IntPoint(e->xcurr, horzEdge->ycurr),
            (IsTopHorz( e->xcurr ))? ipRight : ipBoth );
      }
      else if( dir == dLeftToRight )
      {
        IntersectEdges( horzEdge, e, IntPoint(e->xcurr, horzEdge->ycurr),
          (IsTopHorz( e->xcurr ))? ipLeft : ipBoth );
      }
      else
      {
        IntersectEdges( e, horzEdge, IntPoint(e->xcurr, horzEdge->ycurr),
          (IsTopHorz( e->xcurr ))? ipRight : ipBoth );
      }
      SwapPositionsInAEL( horzEdge, e );
    }
    else if( (dir == dLeftToRight && e->xcurr > horzRight  && m_SortedEdges) ||
     (dir == dRightToLeft && e->xcurr < horzLeft && m_SortedEdges) ) break;
    e = eNext;
  } //end while

  if( horzEdge->nextInLML )
  {
    if( horzEdge->outIdx >= 0 )
      AddOutPt( horzEdge, IntPoint(horzEdge->xtop, horzEdge->ytop));
    UpdateEdgeIntoAEL( horzEdge );
  }
  else
  {
    if ( horzEdge->outIdx >= 0 )
      IntersectEdges( horzEdge, eMaxPair,
      IntPoint(horzEdge->xtop, horzEdge->ycurr), ipBoth);
    assert(eMaxPair);
    if (eMaxPair->outIdx >= 0) throw clipperException("ProcessHorizontal error");
    DeleteFromAEL(eMaxPair);
    DeleteFromAEL(horzEdge);
  }
}